

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O1

void __thiscall QScrollArea::ensureVisible(QScrollArea *this,int x,int y,int xmargin,int ymargin)

{
  long lVar1;
  long lVar2;
  LayoutDirection direction;
  int iVar3;
  QPoint QVar4;
  QAbstractSlider *pQVar5;
  int iVar6;
  Representation RVar7;
  long in_FS_OFFSET;
  QPoint local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  direction = QWidget::layoutDirection((QWidget *)this);
  lVar2 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
  local_48.x2.m_i = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  local_48.y2.m_i = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_50.xp.m_i = x;
  local_50.yp.m_i = y;
  QVar4 = QStyle::visualPos(direction,&local_48,&local_50);
  RVar7 = QVar4.xp.m_i;
  iVar6 = RVar7.m_i - xmargin;
  iVar3 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
  pQVar5 = *(QAbstractSlider **)(lVar1 + 0x288);
  if (iVar6 < iVar3) {
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
LAB_0047ae7a:
    QAbstractSlider::setValue(pQVar5,iVar3);
  }
  else {
    iVar3 = QAbstractSlider::value(pQVar5);
    lVar2 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
    iVar6 = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
    if ((iVar3 - xmargin) + iVar6 + 1 < RVar7.m_i) {
      pQVar5 = *(QAbstractSlider **)(lVar1 + 0x288);
      iVar3 = (RVar7.m_i + xmargin) - (iVar6 + 1);
      iVar6 = QAbstractSlider::maximum(pQVar5);
      if (iVar6 <= iVar3) {
        iVar3 = iVar6;
      }
      goto LAB_0047ae7a;
    }
  }
  iVar6 = y - ymargin;
  iVar3 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x290));
  pQVar5 = *(QAbstractSlider **)(lVar1 + 0x290);
  if (iVar6 < iVar3) {
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
  }
  else {
    iVar3 = QAbstractSlider::value(pQVar5);
    lVar2 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
    iVar6 = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
    if (y <= (iVar3 - ymargin) + iVar6 + 1) goto LAB_0047aeec;
    pQVar5 = *(QAbstractSlider **)(lVar1 + 0x290);
    iVar3 = (ymargin + y) - (iVar6 + 1);
    iVar6 = QAbstractSlider::maximum(pQVar5);
    if (iVar6 <= iVar3) {
      iVar3 = iVar6;
    }
  }
  QAbstractSlider::setValue(pQVar5,iVar3);
LAB_0047aeec:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollArea::ensureVisible(int x, int y, int xmargin, int ymargin)
{
    Q_D(QScrollArea);

    int logicalX = QStyle::visualPos(layoutDirection(), d->viewport->rect(), QPoint(x, y)).x();

    if (logicalX - xmargin < d->hbar->value()) {
        d->hbar->setValue(qMax(0, logicalX - xmargin));
    } else if (logicalX > d->hbar->value() + d->viewport->width() - xmargin) {
        d->hbar->setValue(qMin(logicalX - d->viewport->width() + xmargin, d->hbar->maximum()));
    }

    if (y - ymargin < d->vbar->value()) {
        d->vbar->setValue(qMax(0, y - ymargin));
    } else if (y > d->vbar->value() + d->viewport->height() - ymargin) {
        d->vbar->setValue(qMin(y - d->viewport->height() + ymargin, d->vbar->maximum()));
    }
}